

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_DecodeMonoMSADPCM
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint uVar1;
  uint in_ECX;
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  uint32_t bsize;
  int16_t blockCache [1012];
  int32_t midOffset;
  uint8_t *buf;
  uint32_t done;
  uint32_t copy;
  int16_t *blockCache_00;
  undefined4 in_stack_fffffffffffff7d0;
  int16_t local_828 [1018];
  uint local_34;
  long local_30;
  uint local_24;
  uint32_t local_20;
  uint local_1c;
  float *local_18;
  
  local_24 = 0;
  uVar1 = (uint)*(ushort *)(*(long *)(in_RDI + 0xf8) + 0x12);
  blockCache_00 = *(int16_t **)(in_RSI + 8);
  local_30 = (long)blockCache_00 +
             (ulong)((*(uint *)(in_RDI + 0xf0) / uVar1) *
                    (uint)*(ushort *)(*(long *)(in_RDI + 0xf8) + 0xc));
  local_34 = *(uint *)(in_RDI + 0xf0) % uVar1;
  local_1c = in_ECX;
  local_18 = in_RDX;
  for (; local_24 < local_1c; local_24 = local_20 + local_24) {
    if (local_1c - local_24 < uVar1 - local_34) {
      local_20 = local_1c - local_24;
    }
    else {
      local_20 = uVar1 - local_34;
    }
    FAudio_INTERNAL_DecodeMonoMSADPCMBlock
              ((uint8_t **)CONCAT44(uVar1,in_stack_fffffffffffff7d0),blockCache_00,local_20);
    (*FAudio_INTERNAL_Convert_S16_To_F32)(local_828 + (int)local_34,local_18,local_20);
    local_18 = local_18 + local_20;
    local_34 = 0;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodeMonoMSADPCM(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	/* Loop variables */
	uint32_t copy, done = 0;

	/* Read pointers */
	uint8_t *buf;
	int32_t midOffset;

	/* PCM block cache */
	int16_t blockCache[1012]; /* Max block size */

	/* Block size */
	uint32_t bsize = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;

	LOG_FUNC_ENTER(voice->audio)

	/* Where are we starting? */
	buf = (uint8_t*) buffer->pAudioData + (
		(voice->src.curBufferOffset / bsize) *
		voice->src.format->nBlockAlign
	);

	/* Are we starting in the middle? */
	midOffset = (voice->src.curBufferOffset % bsize);

	/* Read in each block directly to the decode cache */
	while (done < samples)
	{
		copy = FAudio_min(samples - done, bsize - midOffset);
		FAudio_INTERNAL_DecodeMonoMSADPCMBlock(
			&buf,
			blockCache,
			voice->src.format->nBlockAlign
		);
		FAudio_INTERNAL_Convert_S16_To_F32(
			blockCache + midOffset,
			decodeCache,
			copy
		);
		decodeCache += copy;
		done += copy;
		midOffset = 0;
	}
	LOG_FUNC_EXIT(voice->audio)
}